

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsParser.cpp
# Opt level: O2

uint64_t conBytesLL(char *inArry,int start,int cnt)

{
  uint64_t uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  uVar4 = 0;
  if (0 < cnt) {
    uVar4 = (ulong)(uint)cnt;
  }
  iVar2 = cnt * 8;
  uVar1 = 0;
  for (; iVar2 = iVar2 + -8, uVar4 != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = uVar1 | (ulong)(byte)inArry[uVar3 + (long)start] << ((byte)iVar2 & 0x3f);
  }
  return uVar1;
}

Assistant:

uint64_t conBytesLL(char inArry[], int start, int cnt)
{
  unsigned long long outVal = 0;

  for (int i = 0; i < cnt; i++) {
    outVal = ((unsigned long long)(unsigned char)inArry[start + i]
              << ((cnt - i - 1) * 8)) |
             outVal;
  }

  return outVal;
}